

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

shared_ptr<mocker::nasm::Inst> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::shared_ptr<Register>_> *mp)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  undefined **ppuVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  bool bVar7;
  shared_ptr<mocker::nasm::Empty> sVar8;
  shared_ptr<mocker::nasm::Ret> sVar9;
  shared_ptr<mocker::nasm::Call> sVar10;
  shared_ptr<mocker::nasm::Leave> sVar11;
  shared_ptr<mocker::nasm::Jmp> sVar12;
  shared_ptr<mocker::nasm::CJump> sVar13;
  shared_ptr<mocker::nasm::Cqo> sVar14;
  shared_ptr<mocker::nasm::Mov> sVar15;
  shared_ptr<mocker::nasm::Lea> sVar16;
  shared_ptr<mocker::nasm::UnaryInst> sVar17;
  shared_ptr<mocker::nasm::BinaryInst> sVar18;
  shared_ptr<mocker::nasm::Push> sVar19;
  shared_ptr<mocker::nasm::Pop> sVar20;
  shared_ptr<mocker::nasm::Cmp> sVar21;
  shared_ptr<mocker::nasm::Set> sVar22;
  shared_ptr<mocker::nasm::IDiv> sVar23;
  shared_ptr<mocker::nasm::Inst> sVar24;
  shared_ptr<mocker::nasm::Mov> p;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  shared_ptr<mocker::nasm::Addr> local_88;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr<mocker::nasm::Addr> local_68;
  shared_ptr<mocker::nasm::Addr> local_58;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  sVar8 = dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_78,inst)
  ;
  ppuVar6 = (undefined **)
            sVar8.super___shared_ptr<mocker::nasm::Empty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  bVar7 = true;
  if (local_78 == 0) {
    sVar9 = dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_98,inst)
    ;
    ppuVar6 = (undefined **)
              sVar9.super___shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    bVar7 = true;
    if (local_98 == 0) {
      sVar10 = dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
                         ((nasm *)&local_88,inst);
      ppuVar6 = (undefined **)
                sVar10.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      bVar7 = true;
      if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        sVar11 = dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                           ((nasm *)&local_68,inst);
        ppuVar6 = (undefined **)
                  sVar11.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        bVar7 = true;
        if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          sVar12 = dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>
                             ((nasm *)&local_58,inst);
          ppuVar6 = (undefined **)
                    sVar12.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          bVar7 = true;
          if (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            sVar13 = dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>
                               ((nasm *)&local_48,inst);
            ppuVar6 = (undefined **)
                      sVar13.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            bVar7 = true;
            if (local_48 == 0) {
              sVar14 = dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                                 ((nasm *)&local_38,inst);
              ppuVar6 = (undefined **)
                        sVar14.super___shared_ptr<mocker::nasm::Cqo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              bVar7 = local_38 != 0;
              if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
                ppuVar6 = (undefined **)extraout_RDX;
              }
            }
            if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
              ppuVar6 = (undefined **)extraout_RDX_00;
            }
          }
          if (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            ppuVar6 = (undefined **)extraout_RDX_01;
          }
        }
        if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          ppuVar6 = (undefined **)extraout_RDX_02;
        }
      }
      if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        ppuVar6 = (undefined **)extraout_RDX_03;
      }
    }
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      ppuVar6 = (undefined **)extraout_RDX_04;
    }
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    ppuVar6 = (undefined **)extraout_RDX_05;
  }
  if (bVar7) {
    *(element_type **)this =
         (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  else {
    sVar15 = dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
                       ((nasm *)&local_78,inst);
    lVar4 = local_78;
    ppuVar6 = (undefined **)
              sVar15.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (local_78 != 0) {
      local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(local_78 + 8);
      local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x10);
      if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      replaceRegs((nasm *)&local_98,&local_88,mp);
      local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(local_78 + 0x18);
      local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x20);
      if (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      replaceRegs((nasm *)&local_68,&local_58,mp);
      puVar5 = (undefined8 *)operator_new(0x38);
      puVar5[1] = 0x100000001;
      *puVar5 = &PTR___Sp_counted_ptr_inplace_001e8f48;
      ppuVar6 = &PTR__Mov_001e8f98;
      puVar5[2] = &PTR__Mov_001e8f98;
      puVar5[3] = local_98;
      puVar5[4] = p_Stack_90;
      puVar5[5] = local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      puVar5[6] = local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      *(undefined8 **)this = puVar5 + 2;
      *(undefined8 **)(this + 8) = puVar5;
      if (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        ppuVar6 = (undefined **)extraout_RDX_06;
      }
      if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        ppuVar6 = (undefined **)extraout_RDX_07;
      }
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      ppuVar6 = (undefined **)extraout_RDX_08;
    }
    if (lVar4 == 0) {
      sVar16 = dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                         ((nasm *)&local_78,inst);
      lVar4 = local_78;
      ppuVar6 = (undefined **)
                sVar16.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      if (local_78 != 0) {
        local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(local_78 + 8);
        local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x10);
        if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        replaceRegs((nasm *)&local_88,&local_68,mp);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>((nasm *)&local_98,&local_88)
        ;
        replaceRegs((nasm *)&local_58,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 0x18),mp);
        puVar5 = (undefined8 *)operator_new(0x38);
        p_Var2 = p_Stack_90;
        lVar3 = local_98;
        puVar5[1] = 0x100000001;
        *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9220;
        local_98 = 0;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ppuVar6 = &PTR__Lea_001e9270;
        puVar5[2] = &PTR__Lea_001e9270;
        puVar5[3] = lVar3;
        puVar5[4] = p_Var2;
        puVar5[5] = local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        puVar5[6] = local_58.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        *(undefined8 **)this = puVar5 + 2;
        *(undefined8 **)(this + 8) = puVar5;
        if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          ppuVar6 = (undefined **)extraout_RDX_09;
        }
        if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          ppuVar6 = (undefined **)extraout_RDX_10;
        }
      }
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        ppuVar6 = (undefined **)extraout_RDX_11;
      }
      if (lVar4 == 0) {
        sVar17 = dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                           ((nasm *)&local_78,inst);
        lVar4 = local_78;
        ppuVar6 = (undefined **)
                  sVar17.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (local_78 != 0) {
          uVar1 = *(undefined4 *)(local_78 + 8);
          local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_78 + 0x10);
          local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x18);
          if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          replaceRegs((nasm *)&local_88,&local_68,mp);
          dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                    ((nasm *)&local_98,&local_88);
          puVar5 = (undefined8 *)operator_new(0x30);
          p_Var2 = p_Stack_90;
          lVar3 = local_98;
          puVar5[1] = 0x100000001;
          *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9948;
          local_98 = 0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ppuVar6 = &PTR__UnaryInst_001e9998;
          puVar5[2] = &PTR__UnaryInst_001e9998;
          *(undefined4 *)(puVar5 + 3) = uVar1;
          puVar5[4] = lVar3;
          puVar5[5] = p_Var2;
          *(undefined8 **)this = puVar5 + 2;
          *(undefined8 **)(this + 8) = puVar5;
          if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            ppuVar6 = (undefined **)extraout_RDX_12;
          }
          if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            ppuVar6 = (undefined **)extraout_RDX_13;
          }
        }
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
          ppuVar6 = (undefined **)extraout_RDX_14;
        }
        if (lVar4 == 0) {
          sVar18 = dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                             ((nasm *)&local_78,inst);
          lVar4 = local_78;
          ppuVar6 = (undefined **)
                    sVar18.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (local_78 != 0) {
            uVar1 = *(undefined4 *)(local_78 + 8);
            replaceRegs((nasm *)&local_98,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 0x10),mp);
            replaceRegs((nasm *)&local_88,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 0x20),mp);
            puVar5 = (undefined8 *)operator_new(0x40);
            puVar5[1] = 0x100000001;
            *puVar5 = &PTR___Sp_counted_ptr_inplace_001e94c8;
            ppuVar6 = &PTR__BinaryInst_001e9518;
            puVar5[2] = &PTR__BinaryInst_001e9518;
            *(undefined4 *)(puVar5 + 3) = uVar1;
            puVar5[4] = local_98;
            puVar5[5] = p_Stack_90;
            puVar5[6] = local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
            puVar5[7] = local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
            *(undefined8 **)this = puVar5 + 2;
            *(undefined8 **)(this + 8) = puVar5;
          }
          if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
            ppuVar6 = (undefined **)extraout_RDX_15;
          }
          if (lVar4 == 0) {
            sVar19 = dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                               ((nasm *)&local_78,inst);
            lVar4 = local_78;
            ppuVar6 = (undefined **)
                      sVar19.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            if (local_78 != 0) {
              local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)(local_78 + 8);
              local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x10);
              if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              replaceRegs((nasm *)&local_88,&local_68,mp);
              dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                        ((nasm *)&local_98,&local_88);
              puVar5 = (undefined8 *)operator_new(0x28);
              p_Var2 = p_Stack_90;
              lVar3 = local_98;
              puVar5[1] = 0x100000001;
              *puVar5 = &PTR___Sp_counted_ptr_inplace_001e8eb0;
              local_98 = 0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ppuVar6 = &PTR__Push_001e8f00;
              puVar5[2] = &PTR__Push_001e8f00;
              puVar5[3] = lVar3;
              puVar5[4] = p_Var2;
              *(undefined8 **)this = puVar5 + 2;
              *(undefined8 **)(this + 8) = puVar5;
              if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_88.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                ppuVar6 = (undefined **)extraout_RDX_16;
              }
              if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                ppuVar6 = (undefined **)extraout_RDX_17;
              }
            }
            if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
              ppuVar6 = (undefined **)extraout_RDX_18;
            }
            if (lVar4 == 0) {
              sVar20 = dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                                 ((nasm *)&local_78,inst);
              lVar4 = local_78;
              ppuVar6 = (undefined **)
                        sVar20.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              if (local_78 != 0) {
                local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(element_type **)(local_78 + 8);
                local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x10);
                if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_68.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_68.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                replaceRegs((nasm *)&local_88,&local_68,mp);
                dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                          ((nasm *)&local_98,&local_88);
                puVar5 = (undefined8 *)operator_new(0x28);
                p_Var2 = p_Stack_90;
                lVar3 = local_98;
                puVar5[1] = 0x100000001;
                *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9c18;
                local_98 = 0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                ppuVar6 = &PTR__Pop_001e9c68;
                puVar5[2] = &PTR__Pop_001e9c68;
                puVar5[3] = lVar3;
                puVar5[4] = p_Var2;
                *(undefined8 **)this = puVar5 + 2;
                *(undefined8 **)(this + 8) = puVar5;
                if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_88.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                  ppuVar6 = (undefined **)extraout_RDX_19;
                }
                if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_68.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                  ppuVar6 = (undefined **)extraout_RDX_20;
                }
              }
              if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
                ppuVar6 = (undefined **)extraout_RDX_21;
              }
              if (lVar4 == 0) {
                sVar21 = dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                                   ((nasm *)&local_78,inst);
                lVar4 = local_78;
                ppuVar6 = (undefined **)
                          sVar21.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (local_78 != 0) {
                  replaceRegs((nasm *)&local_98,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 8),mp)
                  ;
                  replaceRegs((nasm *)&local_88,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 0x18),
                              mp);
                  puVar5 = (undefined8 *)operator_new(0x38);
                  puVar5[1] = 0x100000001;
                  *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9550;
                  ppuVar6 = &PTR__Cmp_001e95a0;
                  puVar5[2] = &PTR__Cmp_001e95a0;
                  puVar5[3] = local_98;
                  puVar5[4] = p_Stack_90;
                  puVar5[5] = local_88.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                  puVar5[6] = local_88.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                  *(undefined8 **)this = puVar5 + 2;
                  *(undefined8 **)(this + 8) = puVar5;
                }
                if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
                  ppuVar6 = (undefined **)extraout_RDX_22;
                }
                if (lVar4 == 0) {
                  sVar22 = dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                                     ((nasm *)&local_78,inst);
                  lVar4 = local_78;
                  ppuVar6 = (undefined **)
                            sVar22.super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  if (local_78 != 0) {
                    uVar1 = *(undefined4 *)(local_78 + 8);
                    local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = *(element_type **)(local_78 + 0x10);
                    local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 0x18);
                    if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_68.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_68.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    replaceRegs((nasm *)&local_88,&local_68,mp);
                    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                              ((nasm *)&local_98,&local_88);
                    puVar5 = (undefined8 *)operator_new(0x30);
                    p_Var2 = p_Stack_90;
                    lVar3 = local_98;
                    puVar5[1] = 0x100000001;
                    *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9660;
                    local_98 = 0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    ppuVar6 = &PTR__Set_001e96b0;
                    puVar5[2] = &PTR__Set_001e96b0;
                    *(undefined4 *)(puVar5 + 3) = uVar1;
                    puVar5[4] = lVar3;
                    puVar5[5] = p_Var2;
                    *(undefined8 **)this = puVar5 + 2;
                    *(undefined8 **)(this + 8) = puVar5;
                    if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_88.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      ppuVar6 = (undefined **)extraout_RDX_23;
                    }
                    if (local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_68.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      ppuVar6 = (undefined **)extraout_RDX_24;
                    }
                  }
                  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
                    ppuVar6 = (undefined **)extraout_RDX_25;
                  }
                  if (lVar4 == 0) {
                    sVar23 = dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                                       ((nasm *)&local_78,inst);
                    ppuVar6 = (undefined **)
                              sVar23.
                              super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                    if (local_78 != 0) {
                      replaceRegs((nasm *)&local_98,(shared_ptr<mocker::nasm::Addr> *)(local_78 + 8)
                                  ,mp);
                      puVar5 = (undefined8 *)operator_new(0x28);
                      puVar5[1] = 0x100000001;
                      *puVar5 = &PTR___Sp_counted_ptr_inplace_001e9440;
                      ppuVar6 = &PTR__IDiv_001e9490;
                      puVar5[2] = &PTR__IDiv_001e9490;
                      puVar5[3] = local_98;
                      puVar5[4] = p_Stack_90;
                      *(undefined8 **)this = puVar5 + 2;
                      *(undefined8 **)(this + 8) = puVar5;
                    }
                    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
                      ppuVar6 = (undefined **)extraout_RDX_26;
                    }
                    if (local_78 == 0) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                    ,0xdd,
                                    "std::shared_ptr<Inst> mocker::nasm::replaceRegs(const std::shared_ptr<Inst> &, const RegMap<std::shared_ptr<Register>> &)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar24.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar6;
  sVar24.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Inst>)
         sVar24.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Inst> replaceRegs(const std::shared_ptr<Inst> &inst,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Call>(inst) ||
      dyc<Leave>(inst) || dyc<Jmp>(inst) || dyc<CJump>(inst) || dyc<Cqo>(inst))
    return inst;
  if (auto p = dyc<Mov>(inst)) {
    return std::make_shared<Mov>(replaceRegs(p->getDest(), mp),
                                 replaceRegs(p->getOperand(), mp));
  }
  if (auto p = dyc<Lea>(inst)) {
    return std::make_shared<Lea>(dyc<Register>(replaceRegs(p->getDest(), mp)),
                                 replaceRegs(p->getAddr(), mp));
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return std::make_shared<UnaryInst>(
        p->getOp(), dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return std::make_shared<BinaryInst>(p->getType(),
                                        replaceRegs(p->getLhs(), mp),
                                        replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Push>(inst)) {
    return std::make_shared<Push>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Pop>(inst)) {
    return std::make_shared<Pop>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Cmp>(inst)) {
    return std::make_shared<Cmp>(replaceRegs(p->getLhs(), mp),
                                 replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Set>(inst)) {
    return std::make_shared<Set>(p->getOp(),
                                 dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return std::make_shared<IDiv>(replaceRegs(p->getRhs(), mp));
  }
  assert(false);
}